

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Permutazione.cpp
# Opt level: O2

void __thiscall Permutazione::somma(Permutazione *this,Permutazione *p)

{
  ushort uVar1;
  unsigned_short *puVar2;
  unsigned_short k;
  unsigned_short *puVar3;
  ulong uVar4;
  
  uVar1 = this->dimensione;
  puVar3 = (unsigned_short *)operator_new__((ulong)((uint)uVar1 * 2));
  puVar2 = this->individuo;
  for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
    puVar3[uVar4] = p->individuo[puVar2[uVar4]];
  }
  if (puVar2 != (unsigned_short *)0x0) {
    operator_delete__(puVar2);
  }
  this->individuo = puVar3;
  return;
}

Assistant:

void Permutazione::somma(Permutazione* p) {

	unsigned short* individuo = new unsigned short[dimensione];

	for (unsigned short k = 0; k < dimensione; k++) {
		individuo[k] = p->individuo[this->individuo[k]];
	}

	delete[] this->individuo;
	this->individuo = individuo;
}